

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<int,_false>_> *
immutable::rrb_details::copy_first_k<int,false,5>
          (ref<immutable::rrb<int,_false,_5>_> *in,ref<immutable::rrb<int,_false,_5>_> *new_rrb,
          uint32_t k,uint32_t tail_size)

{
  ref<immutable::rrb_details::rrb_size_table<false>_> *this;
  uint32_t uVar1;
  rrb<int,_false,_5> *prVar2;
  rrb_size_table<false> *prVar3;
  uint32_t *puVar4;
  ref<immutable::rrb_details::internal_node<int,_false>_> rVar5;
  internal_node<int,_false> *piVar6;
  char *__function;
  uint uVar7;
  uint32_t uVar8;
  long lVar9;
  ref<immutable::rrb_details::tree_node<int,_false>_> *this_00;
  ulong uVar10;
  uint32_t uVar11;
  ref<immutable::rrb_details::internal_node<int,_false>_> new_current;
  ref<immutable::rrb_details::internal_node<int,_false>_> current;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_60;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_58;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_50;
  uint local_44;
  uint32_t local_40;
  uint32_t local_3c;
  ref<immutable::rrb_details::tree_node<int,_false>_> *local_38;
  
  prVar2 = in->ptr;
  local_40 = tail_size;
  if (prVar2 != (rrb<int,_false,_5> *)0x0) {
    local_50.ptr = (internal_node<int,_false> *)(prVar2->root).ptr;
    if (local_50.ptr != (internal_node<int,_false> *)0x0) {
      (local_50.ptr)->_ref_count = (local_50.ptr)->_ref_count + 1;
    }
    if (new_rrb->ptr != (rrb<int,_false,_5> *)0x0) {
      this_00 = &new_rrb->ptr->root;
      uVar11 = prVar2->shift;
      if (uVar11 != 0 && k != 0) {
        local_44 = prVar2->cnt - 1;
        uVar8 = 1;
        local_3c = k;
        do {
          rVar5.ptr = local_50.ptr;
          local_58.ptr = (internal_node<int,_false> *)0x0;
          if (uVar8 != k) {
            uVar7 = (local_50.ptr)->len;
            local_38 = this_00;
            piVar6 = (internal_node<int,_false> *)malloc((ulong)uVar7 * 8 + 0x20);
            piVar6->len = uVar7;
            piVar6->type = INTERNAL_NODE;
            (piVar6->size_table).ptr = (rrb_size_table<false> *)0x0;
            ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                      (&piVar6->size_table,&(rVar5.ptr)->size_table);
            piVar6->guid = 0;
            piVar6->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar6 + 1);
            uVar7 = (rVar5.ptr)->len;
            memset(piVar6 + 1,0,(ulong)uVar7 * 8);
            if ((ulong)uVar7 != 0) {
              lVar9 = 0;
              uVar10 = 0;
              do {
                ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                          ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                           ((long)&piVar6->child->ptr + lVar9),
                           (ref<immutable::rrb_details::internal_node<int,_false>_> *)
                           ((long)&(rVar5.ptr)->child->ptr + lVar9));
                uVar10 = uVar10 + 1;
                lVar9 = lVar9 + 8;
              } while (uVar10 < (rVar5.ptr)->len);
            }
            piVar6->_ref_count = 1;
            local_60.ptr = piVar6;
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(&local_58,&local_60);
            release<int>(local_60.ptr);
            if (local_50.ptr != (internal_node<int,_false> *)0x0) {
              this_00 = local_38;
              k = local_3c;
              if (((local_50.ptr)->size_table).ptr == (rrb_size_table<false> *)0x0)
              goto LAB_0013abe1;
              if (local_58.ptr != (internal_node<int,_false> *)0x0) {
                this = &(local_58.ptr)->size_table;
                prVar3 = ((local_58.ptr)->size_table).ptr;
                uVar7 = (local_58.ptr)->len;
                piVar6 = (internal_node<int,_false> *)malloc((ulong)uVar7 * 4 + 0x10);
                *(ref<immutable::rrb_details::rrb_size_table<false>_> **)piVar6 =
                     &piVar6->size_table;
                memcpy(&piVar6->size_table,prVar3->size,(ulong)uVar7 << 2);
                piVar6->guid = 0;
                piVar6->_ref_count = 1;
                local_60.ptr = piVar6;
                ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                          (this,(ref<immutable::rrb_details::rrb_size_table<false>_> *)&local_60);
                if ((local_60.ptr != (internal_node<int,_false> *)0x0) &&
                   (uVar1 = (local_60.ptr)->_ref_count, (local_60.ptr)->_ref_count = uVar1 - 1,
                   uVar1 == 1)) {
                  free(local_60.ptr);
                }
                if (local_58.ptr != (internal_node<int,_false> *)0x0) {
                  prVar3 = ((local_58.ptr)->size_table).ptr;
                  if (prVar3 == (rrb_size_table<false> *)0x0) goto LAB_0013acbc;
                  puVar4 = prVar3->size + ((local_58.ptr)->len - 1);
                  *puVar4 = *puVar4 + local_40;
                  this_00 = local_38;
                  k = local_3c;
                  goto LAB_0013abe1;
                }
              }
            }
LAB_0013ac9d:
            __function = 
            "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
            ;
            goto LAB_0013acb2;
          }
          local_60.ptr = internal_node_inc<int,false>(local_50.ptr);
          if (local_60.ptr != (internal_node<int,_false> *)0x0) {
            (local_60.ptr)->_ref_count = 1;
          }
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=(&local_58,&local_60);
          release<int>(local_60.ptr);
          if (local_50.ptr == (internal_node<int,_false> *)0x0) goto LAB_0013ac9d;
          if (((local_50.ptr)->size_table).ptr != (rrb_size_table<false> *)0x0) {
            if (local_58.ptr == (internal_node<int,_false> *)0x0) goto LAB_0013ac9d;
            prVar3 = ((local_58.ptr)->size_table).ptr;
            if (prVar3 == (rrb_size_table<false> *)0x0) {
LAB_0013acbc:
              __function = 
              "T *immutable::ref<immutable::rrb_details::rrb_size_table<false>>::operator->() const [T = immutable::rrb_details::rrb_size_table<false>]"
              ;
              goto LAB_0013acb2;
            }
            puVar4 = prVar3->size;
            puVar4[(local_58.ptr)->len - 1] = puVar4[(local_58.ptr)->len - 2] + local_40;
          }
LAB_0013abe1:
          ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,_false>_> *)this_00,&local_58);
          if (local_50.ptr == (internal_node<int,_false> *)0x0) goto LAB_0013ac9d;
          prVar3 = ((local_50.ptr)->size_table).ptr;
          if (prVar3 == (rrb_size_table<false> *)0x0) {
            uVar7 = local_44 >> ((byte)uVar11 & 0x1f) & 0x1f;
          }
          else {
            if (local_58.ptr == (internal_node<int,_false> *)0x0) goto LAB_0013ac9d;
            uVar7 = (local_58.ptr)->len - 1;
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              local_44 = local_44 - prVar3->size[(local_58.ptr)->len - 2];
            }
          }
          if (local_58.ptr == (internal_node<int,_false> *)0x0) goto LAB_0013ac9d;
          this_00 = (ref<immutable::rrb_details::tree_node<int,_false>_> *)
                    ((local_58.ptr)->child + uVar7);
          if (uVar7 < (local_50.ptr)->len) {
            ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                      (&local_50,(local_50.ptr)->child + uVar7);
          }
          release<int>(local_58.ptr);
          uVar8 = uVar8 + 1;
        } while ((uVar8 <= k) && (uVar11 = uVar11 - 5, uVar11 != 0));
      }
      release<int>(local_50.ptr);
      return (ref<immutable::rrb_details::internal_node<int,_false>_> *)this_00;
    }
  }
  __function = 
  "T *immutable::ref<immutable::rrb<int, false>>::operator->() const [T = immutable::rrb<int, false>]"
  ;
LAB_0013acb2:
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,__function);
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>>* copy_first_k(const ref<rrb<T, atomic_ref_counting, N>>& in, const ref<rrb<T, atomic_ref_counting, N>>& new_rrb, const uint32_t k, const uint32_t tail_size)
      {
      ref<internal_node<T, atomic_ref_counting>> current = in->root;
      ref<internal_node<T, atomic_ref_counting>>* to_set = (ref<internal_node<T, atomic_ref_counting>>*)&new_rrb->root;
      uint32_t index = in->cnt - 1;
      uint32_t shift = in->shift;

      // Copy all non-leaf nodes first. Happens when shift > RRB_BRANCHING
      uint32_t i = 1;
      while (i <= k && shift != 0)
        {
        // First off, copy current node and stick it in.
        ref<internal_node<T, atomic_ref_counting>> new_current;
        if (i != k)
          {
          new_current = internal_node_clone(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table = size_table_clone(new_current->size_table.ptr, new_current->len);
            new_current->size_table->size[new_current->len - 1] += tail_size;
            }
          }
        else
          { // increment size of last element -- will only happen if we append empties
          new_current = internal_node_inc(current.ptr);
          if (current->size_table.ptr != nullptr)
            {
            new_current->size_table->size[new_current->len - 1] = new_current->size_table->size[new_current->len - 2] + tail_size;
            }
          }
        *to_set = new_current;

        // calculate child index
        uint32_t child_index;
        if (current->size_table.ptr == nullptr)
          {
          child_index = (index >> shift) & bits<N>::rrb_mask;
          }
        else
          {
          // no need for sized_pos here, luckily.
          child_index = new_current->len - 1;
          // Decrement index
          if (child_index != 0)
            {
            index -= current->size_table->size[child_index - 1];
            }
          }
        to_set = &new_current->child[child_index];
        if (child_index < current->len)
          current = current->child[child_index];

        i++;
        shift -= bits<N>::rrb_bits;
        }
      return to_set;
      }